

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O0

size_t TdokuEnumerate(char *puzzle,size_t limit,_func_void_char_ptr_void_ptr *callback,
                     void *callback_arg)

{
  size_t sVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  size_t *in_stack_000001d8;
  char *in_stack_000001e0;
  size_t in_stack_000001e8;
  char *in_stack_000001f0;
  SolverDpllTriadSimd<2> *in_stack_000001f8;
  
  (anonymous_namespace)::solver_enum._504_8_ = in_RDX;
  (anonymous_namespace)::solver_enum._512_8_ = in_RCX;
  sVar1 = anon_unknown.dwarf_5a2f::SolverDpllTriadSimd<2>::SolveSudoku
                    (in_stack_000001f8,in_stack_000001f0,in_stack_000001e8,in_stack_000001e0,
                     in_stack_000001d8);
  return sVar1;
}

Assistant:

size_t TdokuEnumerate(const char *puzzle, size_t limit,
                      void (*callback)(const char *, void *), void *callback_arg) {
    solver_enum.callback_ = callback;
    solver_enum.callback_arg_ = callback_arg;
    return solver_enum.SolveSudoku(puzzle, limit, nullptr, nullptr);
}